

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::processSubstitutionGroup
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          ComplexTypeInfo **typeInfo,DatatypeValidator **validator,XMLCh *subsElemQName)

{
  GrammarResolver *pGVar1;
  ComplexTypeInfo **this_00;
  SchemaElementDecl *elem_00;
  bool bVar2;
  ModelTypes toSet;
  uint namespaceURI;
  int iVar3;
  SchemaElementDecl *subsElemDecl_00;
  XMLCh *pXVar4;
  ComplexTypeInfo *pCVar5;
  DatatypeValidator *pDVar6;
  undefined4 extraout_var;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *pRVar7;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar8;
  SchemaInfo *this_01;
  XMLCh *namespaceKey;
  SchemaGrammar *this_02;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *subsElemList;
  SchemaGrammar *aGrammar_1;
  SchemaInfo *curRef;
  BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> importingEnum;
  SchemaGrammar *aGrammar;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *subsElements;
  int subsElemURI;
  XMLCh *subsElemBaseName;
  SchemaElementDecl *subsElemDecl;
  NamespaceScopeManager nsMgr;
  XMLCh *subsElemQName_local;
  DatatypeValidator **validator_local;
  ComplexTypeInfo **typeInfo_local;
  SchemaElementDecl *elemDecl_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)subsElemQName;
  typeInfo_local = (ComplexTypeInfo **)elemDecl;
  elemDecl_local = (SchemaElementDecl *)elem;
  elem_local = (DOMElement *)this;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&subsElemDecl,elem,this->fSchemaInfo,this);
  subsElemDecl_00 = getGlobalElemDecl(this,(DOMElement *)elemDecl_local,(XMLCh *)nsMgr.fSchemaInfo);
  if (subsElemDecl_00 != (SchemaElementDecl *)0x0) {
    bVar2 = isSubstitutionGroupCircular(this,(SchemaElementDecl *)typeInfo_local,subsElemDecl_00);
    elem_00 = elemDecl_local;
    if (bVar2) {
      pXVar4 = XMLElementDecl::getBaseName((XMLElementDecl *)typeInfo_local);
      reportSchemaError(this,(DOMElement *)elem_00,(XMLCh *)XMLUni::fgXMLErrDomain,0x93,pXVar4,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    else {
      pCVar5 = *typeInfo;
      pDVar6 = *validator;
      pXVar4 = XMLElementDecl::getBaseName((XMLElementDecl *)typeInfo_local);
      bVar2 = isSubstitutionGroupValid
                        (this,(DOMElement *)elem_00,subsElemDecl_00,pCVar5,pDVar6,pXVar4,true);
      if (bVar2) {
        SchemaElementDecl::setSubstitutionGroupElem
                  ((SchemaElementDecl *)typeInfo_local,subsElemDecl_00);
        if ((*typeInfo == (ComplexTypeInfo *)0x0) && (*validator == (DatatypeValidator *)0x0)) {
          pCVar5 = SchemaElementDecl::getComplexTypeInfo(subsElemDecl_00);
          *typeInfo = pCVar5;
          pDVar6 = SchemaElementDecl::getDatatypeValidator(subsElemDecl_00);
          *validator = pDVar6;
          if (*validator == (DatatypeValidator *)0x0) {
            if (*typeInfo != (ComplexTypeInfo *)0x0) {
              SchemaElementDecl::setComplexTypeInfo((SchemaElementDecl *)typeInfo_local,*typeInfo);
              this_00 = typeInfo_local;
              toSet = ComplexTypeInfo::getContentType(*typeInfo);
              SchemaElementDecl::setModelType((SchemaElementDecl *)this_00,toSet);
            }
          }
          else {
            SchemaElementDecl::setDatatypeValidator((SchemaElementDecl *)typeInfo_local,*validator);
            SchemaElementDecl::setModelType((SchemaElementDecl *)typeInfo_local,Simple);
          }
        }
        pXVar4 = XMLElementDecl::getBaseName(&subsElemDecl_00->super_XMLElementDecl);
        namespaceURI = XMLElementDecl::getURI(&subsElemDecl_00->super_XMLElementDecl);
        aGrammar = (SchemaGrammar *)
                   RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                   ::get(this->fValidSubstitutionGroups,pXVar4,namespaceURI);
        if ((aGrammar == (SchemaGrammar *)0x0) && (this->fTargetNSURI != namespaceURI)) {
          pGVar1 = this->fGrammarResolver;
          iVar3 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                            (this->fURIStringPool,(ulong)namespaceURI);
          importingEnum.fToEnum =
               (BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)
               GrammarResolver::getGrammar(pGVar1,(XMLCh *)CONCAT44(extraout_var,iVar3));
          if ((SchemaGrammar *)importingEnum.fToEnum != (SchemaGrammar *)0x0) {
            pRVar7 = SchemaGrammar::getValidSubstitutionGroups
                               ((SchemaGrammar *)importingEnum.fToEnum);
            pVVar8 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                     ::get(pRVar7,pXVar4,namespaceURI);
            if (pVVar8 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
              bVar2 = SchemaInfo::circularImportExist(this->fSchemaInfo,namespaceURI);
              if (bVar2) {
                pRVar7 = SchemaGrammar::getValidSubstitutionGroups
                                   ((SchemaGrammar *)importingEnum.fToEnum);
                pVVar8 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                         XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
                ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
                          (pVVar8,8,this->fGrammarPoolMemoryManager,false);
                RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                ::put(pRVar7,pXVar4,namespaceURI,pVVar8);
              }
              aGrammar = (SchemaGrammar *)0x0;
            }
            else {
              aGrammar = (SchemaGrammar *)
                         XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
              ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
                        ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar,pVVar8);
              RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
              ::put(this->fValidSubstitutionGroups,pXVar4,namespaceURI,
                    (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar);
            }
          }
        }
        if (aGrammar == (SchemaGrammar *)0x0) {
          aGrammar = (SchemaGrammar *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
          ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
                    ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar,8,
                     this->fGrammarPoolMemoryManager,false);
          RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
          ::put(this->fValidSubstitutionGroups,pXVar4,namespaceURI,
                (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar);
        }
        ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement
                  ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar,
                   (SchemaElementDecl **)&typeInfo_local);
        SchemaInfo::getImportingListEnumerator
                  ((BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> *)&curRef,this->fSchemaInfo);
        while (bVar2 = BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo>::hasMoreElements
                                 ((BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> *)&curRef),
              bVar2) {
          this_01 = BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo>::nextElement
                              ((BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> *)&curRef);
          pGVar1 = this->fGrammarResolver;
          namespaceKey = SchemaInfo::getTargetNSURIString(this_01);
          this_02 = (SchemaGrammar *)GrammarResolver::getGrammar(pGVar1,namespaceKey);
          pRVar7 = SchemaGrammar::getValidSubstitutionGroups(this_02);
          pVVar8 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                   ::get(pRVar7,pXVar4,namespaceURI);
          if ((pVVar8 != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) &&
             (bVar2 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::containsElement
                                (pVVar8,(SchemaElementDecl **)&typeInfo_local,0), !bVar2)) {
            ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement
                      (pVVar8,(SchemaElementDecl **)&typeInfo_local);
          }
        }
        buildValidSubstitutionListB
                  (this,(DOMElement *)elemDecl_local,(SchemaElementDecl *)typeInfo_local,
                   subsElemDecl_00);
        buildValidSubstitutionListF
                  (this,(DOMElement *)elemDecl_local,(SchemaElementDecl *)typeInfo_local,
                   subsElemDecl_00);
        BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo>::~BaseRefVectorEnumerator
                  ((BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> *)&curRef);
      }
    }
  }
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&subsElemDecl);
  return;
}

Assistant:

void TraverseSchema::processSubstitutionGroup(const DOMElement* const elem,
                                              SchemaElementDecl* const elemDecl,
                                              ComplexTypeInfo*& typeInfo,
                                              DatatypeValidator*& validator,
                                              const XMLCh* const subsElemQName)
{
    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaElementDecl* subsElemDecl = getGlobalElemDecl(elem, subsElemQName);
    if (subsElemDecl)
    {
        if (isSubstitutionGroupCircular(elemDecl, subsElemDecl))
        {
            reportSchemaError(
                elem , XMLUni::fgXMLErrDomain , XMLErrs::CircularSubsGroup, elemDecl->getBaseName());
        }
        else
        {
            // Check for substitution validity constraint
            // Substitution allowed (block and blockDefault) && same type
            if (isSubstitutionGroupValid(elem, subsElemDecl, typeInfo, validator, elemDecl->getBaseName()))
            {
                elemDecl->setSubstitutionGroupElem(subsElemDecl);

                // if type information is missing, use subsGroup one
                if (!typeInfo && !validator)
                {
                    typeInfo = subsElemDecl->getComplexTypeInfo();
                    validator = subsElemDecl->getDatatypeValidator();

                    if (validator)
                    {
                        elemDecl->setDatatypeValidator(validator);
                        elemDecl->setModelType(SchemaElementDecl::Simple);
                    }
                    else if (typeInfo)
                    {
                        elemDecl->setComplexTypeInfo(typeInfo);
                        elemDecl->setModelType((SchemaElementDecl::ModelTypes)typeInfo->getContentType());
                    }
                }

                XMLCh* subsElemBaseName = subsElemDecl->getBaseName();
                int    subsElemURI = subsElemDecl->getURI();
                ValueVectorOf<SchemaElementDecl*>* subsElements =
                    fValidSubstitutionGroups->get(subsElemBaseName, subsElemURI);

                if (!subsElements && fTargetNSURI != subsElemURI)
                {
                    SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(subsElemURI));

                    if (aGrammar)
                    {
                        subsElements = aGrammar->getValidSubstitutionGroups()->get(subsElemBaseName, subsElemURI);

                        if (subsElements)
                        {
                            subsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*subsElements);
                            fValidSubstitutionGroups->put(subsElemBaseName, subsElemURI, subsElements);
                        }
                        else if (fSchemaInfo->circularImportExist(subsElemURI))
                        {
                            aGrammar->getValidSubstitutionGroups()->put(
                            subsElemBaseName, subsElemURI, new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fGrammarPoolMemoryManager));
                        }
                    }
                }

                if (!subsElements)
                {
                    subsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fGrammarPoolMemoryManager);
                    fValidSubstitutionGroups->put(subsElemBaseName, subsElemURI, subsElements);
                }

                subsElements->addElement(elemDecl);

                // update related subs. info in case of circular import
                BaseRefVectorEnumerator<SchemaInfo> importingEnum = fSchemaInfo->getImportingListEnumerator();

                while (importingEnum.hasMoreElements())
                {
                    const SchemaInfo& curRef = importingEnum.nextElement();
                    SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(curRef.getTargetNSURIString());
                    ValueVectorOf<SchemaElementDecl*>* subsElemList =
                        aGrammar->getValidSubstitutionGroups()->get(subsElemBaseName, subsElemURI);

                    if (subsElemList && !subsElemList->containsElement(elemDecl))
                        subsElemList->addElement(elemDecl);
                }

                buildValidSubstitutionListB(elem, elemDecl, subsElemDecl);
                buildValidSubstitutionListF(elem, elemDecl, subsElemDecl);
            }
        }
    }
}